

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,node_type *n)

{
  reference puVar1;
  reference this_00;
  size_type n_00;
  
  if ((this->overwritable_nodes_).
      super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
      m_holder.m_size == 0) {
    n_00 = (this->tree_).m_holder.m_size;
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
    ::priv_push_back<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>const&>
              ((vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
                *)&this->tree_,n);
  }
  else {
    puVar1 = boost::container::
             vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
             ::back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                     *)&this->overwritable_nodes_);
    n_00 = *puVar1;
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::pop_back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                *)&this->overwritable_nodes_);
    this_00 = boost::container::
              vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
              ::at(&this->tree_,n_00);
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::operator=(this_00,n);
  }
  return n_00;
}

Assistant:

std::size_t add_node(const node_type& n)
    {
        if(overwritable_nodes_.empty())
        {
            const std::size_t idx = tree_.size();
            tree_.push_back(n);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_nodes_.back();
            overwritable_nodes_.pop_back();
            tree_.at(idx) = n;
            return idx;
        }
    }